

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::GetGroupObject
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this,ResolvedObject *pResolvedObject
          )

{
  Var aValue;
  ScriptContext *pSVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this_00;
  ArenaAllocator *alloc;
  IDiagObjectModelDisplay *pIVar7;
  Type TVar8;
  
  pResolvedObject->name = L"[Set]";
  pResolvedObject->propId = -1;
  aValue = this->instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = this->scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_008cfb75;
    *puVar6 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008cfb75;
    *puVar6 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008cfb75;
      *puVar6 = 0;
    }
    TVar8 = ((this_00->type).ptr)->typeId;
    if (0x57 < (int)TVar8) {
      BVar5 = RecyclableObject::IsExternal(this_00);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_008cfb75:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
    }
  }
  pResolvedObject->typeId = TVar8;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  alloc = GetArenaFromContext(this->scriptContext);
  pIVar7 = (IDiagObjectModelDisplay *)new<Memory::ArenaAllocator>(0x20,alloc,0x366bee);
  pSVar1 = this->scriptContext;
  pp_Var2 = (_func_int **)pResolvedObject->name;
  pIVar7->_vptr_IDiagObjectModelDisplay = (_func_int **)&PTR_Name_014fa028;
  pIVar7[1]._vptr_IDiagObjectModelDisplay = (_func_int **)pSVar1;
  pIVar7[2]._vptr_IDiagObjectModelDisplay = pp_Var2;
  pIVar7[3]._vptr_IDiagObjectModelDisplay = (_func_int **)this;
  pResolvedObject->objectDisplay = pIVar7;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = Name();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        typedef RecyclableCollectionObjectDisplay<TData> RecyclableDataObjectDisplay;
        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclableDataObjectDisplay, scriptContext, pResolvedObject->name, this);

        return TRUE;
    }